

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPDirective::generateDOT
          (OpenMPDirective *this,ofstream *dot_file,int depth,int index,string *parent_node,
          string *trait_score)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  OpenMPDirectiveKind OVar4;
  pointer pcVar5;
  _Base_ptr p_Var6;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar7;
  OpenMPClause *pOVar8;
  _Alloc_hider _Var9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long *plVar13;
  undefined8 *puVar14;
  size_t sVar15;
  ostream *poVar16;
  char *pcVar17;
  size_type *psVar18;
  ulong *puVar19;
  long *plVar20;
  ulong uVar21;
  SourceLocation *pSVar22;
  pointer ppOVar23;
  undefined8 uVar24;
  uint uVar25;
  OpenMPDirective *pOVar26;
  uint uVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_11;
  string __str_10;
  string list_name;
  string expr_name;
  string tkind;
  string current_line;
  string indent;
  string directive_id;
  string directive_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  ofstream *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ulong *local_288;
  long local_280;
  ulong local_278;
  undefined8 uStack_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  char *local_168;
  undefined8 local_160;
  char local_158;
  undefined7 uStack_157;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  OpenMPDirective *local_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  uint local_e0;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  OVar4 = this->kind;
  local_2b0 = dot_file;
  local_108 = this;
  local_e0 = depth;
  local_98 = trait_score;
  switch(OVar4) {
  case OMPD_for_simd:
    pcVar17 = "for_simd";
    goto LAB_00157cdc;
  default:
    toString_abi_cxx11_(&local_128,this);
    toString_abi_cxx11_(&local_d8,this);
    std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_128);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_168);
    if (local_168 != &local_158) {
      operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00157d1e;
  case OMPD_distribute_simd:
    pcVar17 = "distribute_simd";
    goto LAB_00157cdc;
  case OMPD_distribute_parallel_for:
    pcVar17 = "distribute_parallel_for";
    goto LAB_00157cdc;
  case OMPD_distribute_parallel_do:
    pcVar17 = "distribute_parallel_do";
    goto LAB_00157cdc;
  case OMPD_distribute_parallel_for_simd:
    pcVar17 = "distribute_parallel_for_simd";
    goto LAB_00157cdc;
  case OMPD_distribute_parallel_do_simd:
    pcVar17 = "distribute_parallel_do_simd";
    goto LAB_00157cdc;
  case OMPD_cancellation_point:
    pcVar17 = "cancellation_point";
    goto LAB_00157cdc;
  case OMPD_declare_reduction:
    pcVar17 = "declare_reduction";
    goto LAB_00157cdc;
  case OMPD_declare_mapper:
    pcVar17 = "declare_mapper";
    goto LAB_00157cdc;
  case OMPD_taskloop_simd:
    pcVar17 = "taskloop_simd";
    goto LAB_00157cdc;
  case OMPD_target_data:
    pcVar17 = "target_data";
    goto LAB_00157cdc;
  case OMPD_target_enter_data:
    pcVar17 = "target_enter_data";
    goto LAB_00157cdc;
  case OMPD_target_update:
    pcVar17 = "target_update";
    goto LAB_00157cdc;
  case OMPD_target_exit_data:
    pcVar17 = "target_exit_data";
    goto LAB_00157cdc;
  case OMPD_declare_target:
    pcVar17 = "declare_target";
    goto LAB_00157cdc;
  case OMPD_end_declare_target:
    pcVar17 = "end_declare_target";
    goto LAB_00157cdc;
  case OMPD_depobj:
    pcVar17 = "depobj ";
LAB_00157cdc:
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,(ulong)pcVar17);
    goto LAB_00157d1e;
  case OMPD_teams_distribute:
    break;
  case OMPD_teams_distribute_simd:
    break;
  case OMPD_teams_distribute_parallel_for:
    break;
  case OMPD_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_loop:
    break;
  case OMPD_target_parallel:
    break;
  case OMPD_target_parallel_for:
    break;
  case OMPD_target_parallel_for_simd:
    break;
  case OMPD_target_parallel_loop:
    break;
  case OMPD_target_simd:
    break;
  case OMPD_target_teams:
    break;
  case OMPD_target_teams_distribute:
    break;
  case OMPD_target_teams_distribute_simd:
    break;
  case OMPD_target_teams_loop:
    break;
  case OMPD_target_teams_distribute_parallel_for:
    break;
  case OMPD_target_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_distribute_parallel_do:
    break;
  case OMPD_teams_distribute_parallel_do_simd:
    break;
  case OMPD_target_parallel_do:
    break;
  case OMPD_target_parallel_do_simd:
    break;
  case OMPD_target_teams_distribute_parallel_do:
    break;
  case OMPD_target_teams_distribute_parallel_do_simd:
  }
  std::__cxx11::string::append((char *)&local_b8);
LAB_00157d1e:
  local_168 = &local_158;
  local_160 = 0;
  local_158 = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_128,(char)local_e0);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  pcVar5 = (parent_node->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar5,pcVar5 + parent_node->_M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  plVar13 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1a8,(ulong)local_b8._M_dataplus._M_p);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_1c8.field_2._M_allocated_capacity = *psVar18;
    local_1c8.field_2._8_8_ = plVar13[3];
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar18;
    local_1c8._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_1c8._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_1e8 = &local_1d8;
  puVar19 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar19) {
    local_1d8 = *puVar19;
    lStack_1d0 = plVar13[3];
  }
  else {
    local_1d8 = *puVar19;
    local_1e8 = (ulong *)*plVar13;
  }
  local_1e0 = plVar13[1];
  *plVar13 = (long)puVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  uVar25 = -index;
  if (0 < index) {
    uVar25 = index;
  }
  uVar27 = 1;
  if (9 < uVar25) {
    uVar21 = (ulong)uVar25;
    uVar10 = 4;
    do {
      uVar27 = uVar10;
      uVar12 = (uint)uVar21;
      if (uVar12 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_00157ec0;
      }
      if (uVar12 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_00157ec0;
      }
      if (uVar12 < 10000) goto LAB_00157ec0;
      uVar21 = uVar21 / 10000;
      uVar10 = uVar27 + 4;
    } while (99999 < uVar12);
    uVar27 = uVar27 + 1;
  }
LAB_00157ec0:
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2a8,(char)uVar27 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2a8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar27,uVar25);
  uVar21 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar21 = local_1d8;
  }
  paVar2 = &local_1a8.field_2;
  paVar3 = &local_1c8.field_2;
  paVar28 = &local_2a8.field_2;
  if (uVar21 < local_2a8._M_string_length + local_1e0) {
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar28) {
      uVar24 = local_2a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_2a8._M_string_length + local_1e0) goto LAB_00157f58;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_1e8);
  }
  else {
LAB_00157f58:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_2a8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar18 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_d8.field_2._M_allocated_capacity = *psVar18;
    local_d8.field_2._8_8_ = puVar14[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar18;
    local_d8._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_d8._M_string_length = puVar14[1];
  *puVar14 = psVar18;
  puVar14[1] = 0;
  *(undefined1 *)psVar18 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar28) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2a8,&local_128,parent_node);
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  puVar19 = (ulong *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar19) {
    local_1a8.field_2._M_allocated_capacity = *puVar19;
    local_1a8.field_2._8_8_ = plVar13[3];
    local_1a8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *puVar19;
    local_1a8._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_1a8._M_string_length = plVar13[1];
  *plVar13 = (long)puVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1a8,(ulong)local_d8._M_dataplus._M_p);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_1c8.field_2._M_allocated_capacity = *psVar18;
    local_1c8.field_2._8_8_ = plVar13[3];
    local_1c8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar18;
    local_1c8._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_1c8._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  puVar19 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar19) {
    local_1d8 = *puVar19;
    lStack_1d0 = plVar13[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar19;
    local_1e8 = (ulong *)*plVar13;
  }
  local_1e0 = plVar13[1];
  *plVar13 = (long)puVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_1e8);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar28) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  pcVar17 = local_168;
  if (local_168 == (char *)0x0) {
    std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
  }
  else {
    sVar15 = strlen(local_168);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
  }
  std::__cxx11::string::append((char *)&local_128);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,local_128._M_dataplus._M_p,local_128._M_string_length);
  _Var9._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
  }
  else {
    sVar15 = strlen(local_d8._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,_Var9._M_p,sVar15);
  }
  paVar28 = &local_2a8.field_2;
  std::operator+(&local_1c8," [label = \"",&local_b8);
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  puVar19 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar19) {
    local_1d8 = *puVar19;
    lStack_1d0 = plVar13[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar19;
    local_1e8 = (ulong *)*plVar13;
  }
  local_1e0 = plVar13[1];
  *plVar13 = (long)puVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_1e8,local_1e0);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  iVar11 = std::__cxx11::string::compare((char *)local_98);
  if (iVar11 != 0) {
    std::operator+(&local_2d0,&local_128,&local_d8);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_2a8.field_2._M_allocated_capacity = *psVar18;
      local_2a8.field_2._8_8_ = plVar13[3];
      local_2a8._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *psVar18;
      local_2a8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_2a8._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2a8,(ulong)local_d8._M_dataplus._M_p);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_1a8.field_2._M_allocated_capacity = *psVar18;
      local_1a8.field_2._8_8_ = plVar13[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar18;
      local_1a8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1a8._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_1c8.field_2._M_allocated_capacity = *psVar18;
      local_1c8.field_2._8_8_ = plVar13[3];
      local_1c8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar18;
      local_1c8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1c8._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_1d8 = *puVar19;
      lStack_1d0 = plVar13[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *puVar19;
      local_1e8 = (ulong *)*plVar13;
    }
    local_1e0 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_1e8);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar28) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_2d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    pcVar17 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
    }
    else {
      sVar15 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
    }
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)&local_288);
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_d8._M_dataplus._M_p);
    puVar19 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_2d0.field_2._M_allocated_capacity = *puVar19;
      local_2d0.field_2._8_8_ = puVar14[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *puVar19;
      local_2d0._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_2d0._M_string_length = puVar14[1];
    *puVar14 = puVar19;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_2a8.field_2._M_allocated_capacity = *puVar19;
      local_2a8.field_2._8_8_ = plVar13[3];
      local_2a8._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *puVar19;
      local_2a8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_2a8._M_string_length = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_1a8.field_2._M_allocated_capacity = *puVar19;
      local_1a8.field_2._8_8_ = plVar13[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar19;
      local_1a8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1a8._M_string_length = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)(local_98->_M_dataplus)._M_p);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_1c8.field_2._M_allocated_capacity = *psVar18;
      local_1c8.field_2._8_8_ = plVar13[3];
      local_1c8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar18;
      local_1c8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1c8._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_1d8 = *puVar19;
      lStack_1d0 = plVar13[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *puVar19;
      local_1e8 = (ulong *)*plVar13;
    }
    local_1e0 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_1e8);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    pcVar17 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
    }
    else {
      sVar15 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
    }
  }
  pOVar26 = local_108;
  paVar28 = &local_2a8.field_2;
  if (OVar4 == OMPD_declare_reduction) {
    local_1e8 = &local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_108[1].clauses_in_original_order,
               (long)&((local_108[1].clauses_in_original_order)->
                      super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + *(long *)&local_108[1].clauses._M_t._M_impl
              );
    p_Var6 = pOVar26[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1c8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,p_Var6,
               (long)&(pOVar26[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->
                      _M_color + (long)p_Var6);
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_allocated_capacity =
         local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_allocated_capacity =
         local_2a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    local_2a8._M_dataplus._M_p = (pointer)paVar28;
    local_1a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"declare_reduction","");
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_2d0._M_dataplus._M_p,
               local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
    std::__cxx11::string::append((char *)&local_288);
    std::operator+(&local_208,&local_128,&local_2d0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_218 = *puVar19;
      lStack_210 = plVar13[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *puVar19;
      local_228 = (ulong *)*plVar13;
    }
    local_220 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_288);
    paVar28 = &local_248.field_2;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_248.field_2._M_allocated_capacity = *psVar18;
      local_248.field_2._8_8_ = plVar13[3];
      local_248._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar18;
      local_248._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_248._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268.field_2._8_8_ = plVar13[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_268._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar28) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    pcVar17 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
    }
    else {
      sVar15 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
    }
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)&local_100);
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_288);
    local_188 = &local_178;
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_178 = *puVar19;
      lStack_170 = plVar13[3];
    }
    else {
      local_178 = *puVar19;
      local_188 = (ulong *)*plVar13;
    }
    local_180 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_148.field_2._M_allocated_capacity = *psVar18;
      local_148.field_2._8_8_ = plVar13[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar18;
      local_148._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_148._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_288);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208.field_2._8_8_ = plVar13[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_208._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_218 = *puVar19;
      lStack_210 = plVar13[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *puVar19;
      local_228 = (ulong *)*plVar13;
    }
    local_220 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1e8);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_248.field_2._M_allocated_capacity = *puVar19;
      local_248.field_2._8_8_ = plVar13[3];
      local_248._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_248.field_2._M_allocated_capacity = *puVar19;
      local_248._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_248._M_string_length = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268.field_2._8_8_ = plVar13[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_268._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar28) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    pcVar17 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
    }
    else {
      sVar15 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
    }
    local_248._M_dataplus._M_p = (pointer)paVar28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_2d0._M_dataplus._M_p,
               local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
    std::__cxx11::string::append((char *)&local_248);
    local_228 = &local_218;
    std::__cxx11::string::_M_construct((ulong)&local_228,'\x01');
    *(undefined1 *)local_228 = 0x30;
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar28) {
      uVar24 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_220 + local_248._M_string_length) {
      uVar21 = 0xf;
      if (local_228 != &local_218) {
        uVar21 = local_218;
      }
      if (uVar21 < local_220 + local_248._M_string_length) goto LAB_001592c0;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_228,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_001592c0:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228);
    }
    psVar18 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268.field_2._8_8_ = puVar14[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_268._M_string_length = puVar14[1];
    *puVar14 = psVar18;
    puVar14[1] = 0;
    *(undefined1 *)psVar18 = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_268);
    paVar2 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar28) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_208,&local_128,&local_2d0);
    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
    puVar19 = puVar14 + 2;
    if ((ulong *)*puVar14 == puVar19) {
      local_218 = *puVar19;
      lStack_210 = puVar14[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *puVar19;
      local_228 = (ulong *)*puVar14;
    }
    local_220 = puVar14[1];
    *puVar14 = puVar19;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1a8._M_dataplus._M_p);
    puVar19 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_248.field_2._M_allocated_capacity = *puVar19;
      local_248.field_2._8_8_ = puVar14[3];
      local_248._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_248.field_2._M_allocated_capacity = *puVar19;
      local_248._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_248._M_string_length = puVar14[1];
    *puVar14 = puVar19;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268.field_2._8_8_ = plVar13[3];
      local_268._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_268._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar28) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    pcVar17 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
    }
    else {
      sVar15 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
    }
    pSVar22 = *(SourceLocation **)&pOVar26[1].super_SourceLocation;
    if (pSVar22 != pOVar26[1].super_SourceLocation.parent_construct) {
      uVar25 = 0;
      do {
        local_248._M_dataplus._M_p = (pointer)paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,local_1a8._M_dataplus._M_p,
                   local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
        std::__cxx11::string::append((char *)&local_248);
        uVar27 = 1;
        if (9 < uVar25) {
          uVar21 = (ulong)uVar25;
          uVar10 = 4;
          do {
            uVar27 = uVar10;
            uVar12 = (uint)uVar21;
            if (uVar12 < 100) {
              uVar27 = uVar27 - 2;
              goto LAB_0015aec1;
            }
            if (uVar12 < 1000) {
              uVar27 = uVar27 - 1;
              goto LAB_0015aec1;
            }
            if (uVar12 < 10000) goto LAB_0015aec1;
            uVar21 = uVar21 / 10000;
            uVar10 = uVar27 + 4;
          } while (99999 < uVar12);
          uVar27 = uVar27 + 1;
        }
LAB_0015aec1:
        local_228 = &local_218;
        std::__cxx11::string::_M_construct((ulong)&local_228,(char)uVar27);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_228,uVar27,uVar25);
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar28) {
          uVar24 = local_248.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_220 + local_248._M_string_length) {
          uVar21 = 0xf;
          if (local_228 != &local_218) {
            uVar21 = local_218;
          }
          if (uVar21 < local_220 + local_248._M_string_length) goto LAB_0015af53;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_228,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
        }
        else {
LAB_0015af53:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228);
        }
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        psVar18 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_268.field_2._M_allocated_capacity = *psVar18;
          local_268.field_2._8_8_ = puVar14[3];
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar18;
          local_268._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_268._M_string_length = puVar14[1];
        *puVar14 = psVar18;
        puVar14[1] = 0;
        *(undefined1 *)psVar18 = 0;
        std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar28) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_148,&local_128,&local_128);
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_148,(ulong)local_1a8._M_dataplus._M_p);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        psVar18 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_208.field_2._M_allocated_capacity = *psVar18;
          local_208.field_2._8_8_ = plVar13[3];
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar18;
          local_208._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_208._M_string_length = plVar13[1];
        *plVar13 = (long)psVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_208);
        puVar19 = (ulong *)(plVar13 + 2);
        if ((ulong *)*plVar13 == puVar19) {
          local_218 = *puVar19;
          lStack_210 = plVar13[3];
          local_228 = &local_218;
        }
        else {
          local_218 = *puVar19;
          local_228 = (ulong *)*plVar13;
        }
        local_220 = plVar13[1];
        *plVar13 = (long)puVar19;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_228,(ulong)local_2a8._M_dataplus._M_p);
        psVar18 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_248.field_2._M_allocated_capacity = *psVar18;
          local_248.field_2._8_8_ = plVar13[3];
          local_248._M_dataplus._M_p = (pointer)paVar28;
        }
        else {
          local_248.field_2._M_allocated_capacity = *psVar18;
          local_248._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_248._M_string_length = plVar13[1];
        *plVar13 = (long)psVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
        psVar18 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_268.field_2._M_allocated_capacity = *psVar18;
          local_268.field_2._8_8_ = plVar13[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar18;
          local_268._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_268._M_string_length = plVar13[1];
        *plVar13 = (long)psVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar28) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        pcVar17 = local_168;
        if (local_168 == (char *)0x0) {
          std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
        }
        else {
          sVar15 = strlen(local_168);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
        }
        std::operator+(&local_50,&local_128,&local_128);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_100 = &local_f0;
        plVar20 = plVar13 + 2;
        if ((long *)*plVar13 == plVar20) {
          local_f0 = *plVar20;
          lStack_e8 = plVar13[3];
        }
        else {
          local_f0 = *plVar20;
          local_100 = (long *)*plVar13;
        }
        local_f8 = plVar13[1];
        *plVar13 = (long)plVar20;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_100,(ulong)local_2a8._M_dataplus._M_p);
        local_188 = &local_178;
        puVar19 = (ulong *)(plVar13 + 2);
        if ((ulong *)*plVar13 == puVar19) {
          local_178 = *puVar19;
          lStack_170 = plVar13[3];
        }
        else {
          local_178 = *puVar19;
          local_188 = (ulong *)*plVar13;
        }
        local_180 = plVar13[1];
        *plVar13 = (long)puVar19;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar18 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_148.field_2._M_allocated_capacity = *psVar18;
          local_148.field_2._8_8_ = plVar13[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar18;
          local_148._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_148._M_string_length = plVar13[1];
        *plVar13 = (long)psVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_148,(ulong)local_2a8._M_dataplus._M_p);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        psVar18 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_208.field_2._M_allocated_capacity = *psVar18;
          local_208.field_2._8_8_ = plVar13[3];
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar18;
          local_208._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_208._M_string_length = plVar13[1];
        *plVar13 = (long)psVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
        puVar19 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar19) {
          local_218 = *puVar19;
          lStack_210 = puVar14[3];
          local_228 = &local_218;
        }
        else {
          local_218 = *puVar19;
          local_228 = (ulong *)*puVar14;
        }
        local_220 = puVar14[1];
        *puVar14 = puVar19;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,*(char **)pSVar22,&local_d9);
        uVar21 = 0xf;
        if (local_228 != &local_218) {
          uVar21 = local_218;
        }
        if (uVar21 < (ulong)(local_88 + local_220)) {
          uVar21 = 0xf;
          if (local_90 != local_80) {
            uVar21 = local_80[0];
          }
          if (uVar21 < (ulong)(local_88 + local_220)) goto LAB_0015b568;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_228);
        }
        else {
LAB_0015b568:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_90);
        }
        puVar19 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar19) {
          local_248.field_2._M_allocated_capacity = *puVar19;
          local_248.field_2._8_8_ = puVar14[3];
          local_248._M_dataplus._M_p = (pointer)paVar28;
        }
        else {
          local_248.field_2._M_allocated_capacity = *puVar19;
          local_248._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_248._M_string_length = puVar14[1];
        *puVar14 = puVar19;
        puVar14[1] = 0;
        *(undefined1 *)puVar19 = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
        psVar18 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_268.field_2._M_allocated_capacity = *psVar18;
          local_268.field_2._8_8_ = plVar13[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar18;
          local_268._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_268._M_string_length = plVar13[1];
        *plVar13 = (long)psVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar28) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pcVar17 = local_168;
        if (local_168 == (char *)0x0) {
          std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
        }
        else {
          sVar15 = strlen(local_168);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
        }
        uVar25 = uVar25 + 1;
        pSVar22 = (SourceLocation *)&pSVar22->parent_construct;
      } while (pSVar22 != local_108[1].super_SourceLocation.parent_construct);
    }
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_2d0._M_dataplus._M_p,
               local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
    std::__cxx11::string::append((char *)&local_268);
    pOVar26 = local_108;
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
    paVar2 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_208,&local_128,&local_2d0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_228 = &local_218;
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_218 = *puVar19;
      lStack_210 = plVar13[3];
    }
    else {
      local_218 = *puVar19;
      local_228 = (ulong *)*plVar13;
    }
    local_220 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_288);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_248.field_2._M_allocated_capacity = *psVar18;
      local_248.field_2._8_8_ = plVar13[3];
      local_248._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar18;
      local_248._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_248._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268.field_2._8_8_ = plVar13[3];
      local_268._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_268._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar28) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    pcVar17 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
    }
    else {
      sVar15 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
    }
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)&local_100);
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_288);
    local_188 = &local_178;
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_178 = *puVar19;
      lStack_170 = plVar13[3];
    }
    else {
      local_178 = *puVar19;
      local_188 = (ulong *)*plVar13;
    }
    local_180 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_148.field_2._M_allocated_capacity = *psVar18;
      local_148.field_2._8_8_ = plVar13[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar18;
      local_148._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_148._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_288);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208.field_2._8_8_ = plVar13[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar18;
      local_208._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_208._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_228 = &local_218;
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_218 = *puVar19;
      lStack_210 = plVar13[3];
    }
    else {
      local_218 = *puVar19;
      local_228 = (ulong *)*plVar13;
    }
    local_220 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_228,(ulong)local_1c8._M_dataplus._M_p);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_248.field_2._M_allocated_capacity = *psVar18;
      local_248.field_2._8_8_ = plVar13[3];
      local_248._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar18;
      local_248._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_248._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268.field_2._8_8_ = plVar13[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar18;
      local_268._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_268._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar28) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    pcVar17 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
    }
    else {
      sVar15 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_0015a9e5;
  }
  else {
    if (OVar4 == OMPD_threadprivate) {
      local_1e0 = 0;
      local_1d8 = (ulong)local_1d8._1_7_ << 8;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1c8.field_2._M_allocated_capacity._1_7_ << 8;
      local_1e8 = &local_1d8;
      local_1c8._M_dataplus._M_p = (pointer)paVar3;
      local_1a8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"threadprivate","");
      paVar2 = &local_2d0.field_2;
      local_2d0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      pOVar26 = local_108;
      std::__cxx11::string::append((char *)&local_2d0);
      local_288 = &local_278;
      std::__cxx11::string::_M_construct((ulong)&local_288,'\x01');
      *(undefined1 *)local_288 = 0x30;
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        uVar24 = local_2d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_280 + local_2d0._M_string_length) {
        uVar21 = 0xf;
        if (local_288 != &local_278) {
          uVar21 = local_278;
        }
        if (uVar21 < local_280 + local_2d0._M_string_length) goto LAB_00158b4a;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_288,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
      }
      else {
LAB_00158b4a:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_288)
        ;
      }
      psVar18 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_2a8.field_2._M_allocated_capacity = *psVar18;
        local_2a8.field_2._8_8_ = puVar14[3];
        local_2a8._M_dataplus._M_p = (pointer)paVar28;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar18;
        local_2a8._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_2a8._M_string_length = puVar14[1];
      *puVar14 = psVar18;
      puVar14[1] = 0;
      *(undefined1 *)psVar18 = 0;
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar28) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_268,&local_128,&local_1a8);
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
      puVar19 = puVar14 + 2;
      if ((ulong *)*puVar14 == puVar19) {
        local_278 = *puVar19;
        uStack_270 = puVar14[3];
        local_288 = &local_278;
      }
      else {
        local_278 = *puVar19;
        local_288 = (ulong *)*puVar14;
      }
      local_280 = puVar14[1];
      *puVar14 = puVar19;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_1e8);
      puVar19 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_2d0.field_2._M_allocated_capacity = *puVar19;
        local_2d0.field_2._8_8_ = puVar14[3];
        local_2d0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *puVar19;
        local_2d0._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_2d0._M_string_length = puVar14[1];
      *puVar14 = puVar19;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      puVar19 = (ulong *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_2a8.field_2._M_allocated_capacity = *puVar19;
        local_2a8.field_2._8_8_ = plVar13[3];
        local_2a8._M_dataplus._M_p = (pointer)paVar28;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *puVar19;
        local_2a8._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_2a8._M_string_length = plVar13[1];
      *plVar13 = (long)puVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar28) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      pcVar17 = local_168;
      if (local_168 == (char *)0x0) {
        std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
      }
      else {
        sVar15 = strlen(local_168);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
      }
      pSVar22 = *(SourceLocation **)&pOVar26[1].super_SourceLocation;
      if (pSVar22 != pOVar26[1].super_SourceLocation.parent_construct) {
        uVar25 = 0;
        do {
          local_2d0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,local_1e8,local_1e0 + (long)local_1e8);
          std::__cxx11::string::append((char *)&local_2d0);
          uVar27 = 1;
          if (9 < uVar25) {
            uVar21 = (ulong)uVar25;
            uVar10 = 4;
            do {
              uVar27 = uVar10;
              uVar12 = (uint)uVar21;
              if (uVar12 < 100) {
                uVar27 = uVar27 - 2;
                goto LAB_001595eb;
              }
              if (uVar12 < 1000) {
                uVar27 = uVar27 - 1;
                goto LAB_001595eb;
              }
              if (uVar12 < 10000) goto LAB_001595eb;
              uVar21 = uVar21 / 10000;
              uVar10 = uVar27 + 4;
            } while (99999 < uVar12);
            uVar27 = uVar27 + 1;
          }
LAB_001595eb:
          local_288 = &local_278;
          std::__cxx11::string::_M_construct((ulong)&local_288,(char)uVar27);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_288,uVar27,uVar25);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            uVar24 = local_2d0.field_2._M_allocated_capacity;
          }
          paVar28 = &local_2a8.field_2;
          if ((ulong)uVar24 < local_280 + local_2d0._M_string_length) {
            uVar21 = 0xf;
            if (local_288 != &local_278) {
              uVar21 = local_278;
            }
            if (uVar21 < local_280 + local_2d0._M_string_length) goto LAB_00159657;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_288,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
          }
          else {
LAB_00159657:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_288);
          }
          psVar18 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8.field_2._8_8_ = puVar14[3];
            local_2a8._M_dataplus._M_p = (pointer)paVar28;
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_2a8._M_string_length = puVar14[1];
          *puVar14 = psVar18;
          puVar14[1] = 0;
          *(undefined1 *)psVar18 = 0;
          std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar28) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_248,&local_128,&local_128);
          plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1e8);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268.field_2._8_8_ = plVar13[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_268._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
          puVar19 = puVar14 + 2;
          if ((ulong *)*puVar14 == puVar19) {
            local_278 = *puVar19;
            uStack_270 = puVar14[3];
            local_288 = &local_278;
          }
          else {
            local_278 = *puVar19;
            local_288 = (ulong *)*puVar14;
          }
          local_280 = puVar14[1];
          *puVar14 = puVar19;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_288,(ulong)local_1c8._M_dataplus._M_p);
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2d0.field_2._M_allocated_capacity = *psVar18;
            local_2d0.field_2._8_8_ = plVar13[3];
            local_2d0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar18;
            local_2d0._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_2d0._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8.field_2._8_8_ = plVar13[3];
            local_2a8._M_dataplus._M_p = (pointer)paVar28;
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_2a8._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar28) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          pcVar17 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
          }
          else {
            sVar15 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
          }
          std::operator+(&local_148,&local_128,&local_128);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_208.field_2._M_allocated_capacity = *psVar18;
            local_208.field_2._8_8_ = plVar13[3];
          }
          else {
            local_208.field_2._M_allocated_capacity = *psVar18;
            local_208._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_208._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_208,(ulong)local_1c8._M_dataplus._M_p);
          local_228 = &local_218;
          puVar19 = (ulong *)(plVar13 + 2);
          if ((ulong *)*plVar13 == puVar19) {
            local_218 = *puVar19;
            lStack_210 = plVar13[3];
          }
          else {
            local_218 = *puVar19;
            local_228 = (ulong *)*plVar13;
          }
          local_220 = plVar13[1];
          *plVar13 = (long)puVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_228);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_248.field_2._M_allocated_capacity = *psVar18;
            local_248.field_2._8_8_ = plVar13[3];
          }
          else {
            local_248.field_2._M_allocated_capacity = *psVar18;
            local_248._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_248._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_248,(ulong)local_1c8._M_dataplus._M_p);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268.field_2._8_8_ = plVar13[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_268._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
          puVar19 = puVar14 + 2;
          if ((ulong *)*puVar14 == puVar19) {
            local_278 = *puVar19;
            uStack_270 = puVar14[3];
            local_288 = &local_278;
          }
          else {
            local_278 = *puVar19;
            local_288 = (ulong *)*puVar14;
          }
          local_280 = puVar14[1];
          *puVar14 = puVar19;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,*(char **)pSVar22,(allocator<char> *)&local_100);
          uVar21 = 0xf;
          if (local_288 != &local_278) {
            uVar21 = local_278;
          }
          if (uVar21 < (ulong)(local_180 + local_280)) {
            uVar21 = 0xf;
            if (local_188 != &local_178) {
              uVar21 = local_178;
            }
            if (uVar21 < (ulong)(local_180 + local_280)) goto LAB_00159bf2;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,(ulong)local_288);
          }
          else {
LAB_00159bf2:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_188);
          }
          puVar19 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_2d0.field_2._M_allocated_capacity = *puVar19;
            local_2d0.field_2._8_8_ = puVar14[3];
            local_2d0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *puVar19;
            local_2d0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_2d0._M_string_length = puVar14[1];
          *puVar14 = puVar19;
          puVar14[1] = 0;
          *(undefined1 *)puVar19 = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          puVar19 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_2a8.field_2._M_allocated_capacity = *puVar19;
            local_2a8.field_2._8_8_ = plVar13[3];
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *puVar19;
            local_2a8._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_2a8._M_string_length = plVar13[1];
          *plVar13 = (long)puVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          if (local_228 != &local_218) {
            operator_delete(local_228,local_218 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          pcVar17 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
          }
          else {
            sVar15 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
          }
          uVar25 = uVar25 + 1;
          pSVar22 = (SourceLocation *)&pSVar22->parent_construct;
        } while (pSVar22 != local_108[1].super_SourceLocation.parent_construct);
      }
    }
    else {
      if (OVar4 != OMPD_allocate) goto LAB_0015aa12;
      local_1e0 = 0;
      local_1d8 = (ulong)local_1d8._1_7_ << 8;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1c8.field_2._M_allocated_capacity._1_7_ << 8;
      local_1e8 = &local_1d8;
      local_1c8._M_dataplus._M_p = (pointer)paVar3;
      local_1a8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"allocate","");
      paVar2 = &local_2d0.field_2;
      local_2d0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      std::__cxx11::string::append((char *)&local_2d0);
      local_288 = &local_278;
      std::__cxx11::string::_M_construct((ulong)&local_288,'\x01');
      *(undefined1 *)local_288 = 0x30;
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        uVar24 = local_2d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_280 + local_2d0._M_string_length) {
        uVar21 = 0xf;
        if (local_288 != &local_278) {
          uVar21 = local_278;
        }
        if (uVar21 < local_280 + local_2d0._M_string_length) goto LAB_00158a45;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_288,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
      }
      else {
LAB_00158a45:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_288)
        ;
      }
      psVar18 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_2a8.field_2._M_allocated_capacity = *psVar18;
        local_2a8.field_2._8_8_ = puVar14[3];
        local_2a8._M_dataplus._M_p = (pointer)paVar28;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar18;
        local_2a8._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_2a8._M_string_length = puVar14[1];
      *puVar14 = psVar18;
      puVar14[1] = 0;
      *(undefined1 *)psVar18 = 0;
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar28) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_268,&local_128,&local_1a8);
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
      puVar19 = puVar14 + 2;
      if ((ulong *)*puVar14 == puVar19) {
        local_278 = *puVar19;
        uStack_270 = puVar14[3];
        local_288 = &local_278;
      }
      else {
        local_278 = *puVar19;
        local_288 = (ulong *)*puVar14;
      }
      local_280 = puVar14[1];
      *puVar14 = puVar19;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_1e8);
      puVar19 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_2d0.field_2._M_allocated_capacity = *puVar19;
        local_2d0.field_2._8_8_ = puVar14[3];
        local_2d0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *puVar19;
        local_2d0._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_2d0._M_string_length = puVar14[1];
      *puVar14 = puVar19;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      puVar19 = (ulong *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_2a8.field_2._M_allocated_capacity = *puVar19;
        local_2a8.field_2._8_8_ = plVar13[3];
        local_2a8._M_dataplus._M_p = (pointer)paVar28;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *puVar19;
        local_2a8._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_2a8._M_string_length = plVar13[1];
      *plVar13 = (long)puVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar28) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      pcVar17 = local_168;
      if (local_168 == (char *)0x0) {
        std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
      }
      else {
        sVar15 = strlen(local_168);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
      }
      pSVar22 = *(SourceLocation **)&pOVar26[1].super_SourceLocation;
      if (pSVar22 != pOVar26[1].super_SourceLocation.parent_construct) {
        uVar25 = 0;
        do {
          local_2d0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,local_1e8,local_1e0 + (long)local_1e8);
          std::__cxx11::string::append((char *)&local_2d0);
          uVar27 = 1;
          if (9 < uVar25) {
            uVar21 = (ulong)uVar25;
            uVar10 = 4;
            do {
              uVar27 = uVar10;
              uVar12 = (uint)uVar21;
              if (uVar12 < 100) {
                uVar27 = uVar27 - 2;
                goto LAB_0015a152;
              }
              if (uVar12 < 1000) {
                uVar27 = uVar27 - 1;
                goto LAB_0015a152;
              }
              if (uVar12 < 10000) goto LAB_0015a152;
              uVar21 = uVar21 / 10000;
              uVar10 = uVar27 + 4;
            } while (99999 < uVar12);
            uVar27 = uVar27 + 1;
          }
LAB_0015a152:
          local_288 = &local_278;
          std::__cxx11::string::_M_construct((ulong)&local_288,(char)uVar27);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_288,uVar27,uVar25);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            uVar24 = local_2d0.field_2._M_allocated_capacity;
          }
          paVar28 = &local_2a8.field_2;
          if ((ulong)uVar24 < local_280 + local_2d0._M_string_length) {
            uVar21 = 0xf;
            if (local_288 != &local_278) {
              uVar21 = local_278;
            }
            if (uVar21 < local_280 + local_2d0._M_string_length) goto LAB_0015a1be;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_288,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
          }
          else {
LAB_0015a1be:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_288);
          }
          psVar18 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8.field_2._8_8_ = puVar14[3];
            local_2a8._M_dataplus._M_p = (pointer)paVar28;
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_2a8._M_string_length = puVar14[1];
          *puVar14 = psVar18;
          puVar14[1] = 0;
          *(undefined1 *)psVar18 = 0;
          std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar28) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_248,&local_128,&local_128);
          plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1e8);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268.field_2._8_8_ = plVar13[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_268._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
          puVar19 = puVar14 + 2;
          if ((ulong *)*puVar14 == puVar19) {
            local_278 = *puVar19;
            uStack_270 = puVar14[3];
            local_288 = &local_278;
          }
          else {
            local_278 = *puVar19;
            local_288 = (ulong *)*puVar14;
          }
          local_280 = puVar14[1];
          *puVar14 = puVar19;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_288,(ulong)local_1c8._M_dataplus._M_p);
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2d0.field_2._M_allocated_capacity = *psVar18;
            local_2d0.field_2._8_8_ = plVar13[3];
            local_2d0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar18;
            local_2d0._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_2d0._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8.field_2._8_8_ = plVar13[3];
            local_2a8._M_dataplus._M_p = (pointer)paVar28;
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *psVar18;
            local_2a8._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_2a8._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar28) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          pcVar17 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
          }
          else {
            sVar15 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
          }
          std::operator+(&local_148,&local_128,&local_128);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_208.field_2._M_allocated_capacity = *psVar18;
            local_208.field_2._8_8_ = plVar13[3];
          }
          else {
            local_208.field_2._M_allocated_capacity = *psVar18;
            local_208._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_208._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_208,(ulong)local_1c8._M_dataplus._M_p);
          local_228 = &local_218;
          puVar19 = (ulong *)(plVar13 + 2);
          if ((ulong *)*plVar13 == puVar19) {
            local_218 = *puVar19;
            lStack_210 = plVar13[3];
          }
          else {
            local_218 = *puVar19;
            local_228 = (ulong *)*plVar13;
          }
          local_220 = plVar13[1];
          *plVar13 = (long)puVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_228);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_248.field_2._M_allocated_capacity = *psVar18;
            local_248.field_2._8_8_ = plVar13[3];
          }
          else {
            local_248.field_2._M_allocated_capacity = *psVar18;
            local_248._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_248._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_248,(ulong)local_1c8._M_dataplus._M_p);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar18 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268.field_2._8_8_ = plVar13[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar18;
            local_268._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_268._M_string_length = plVar13[1];
          *plVar13 = (long)psVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
          puVar19 = puVar14 + 2;
          if ((ulong *)*puVar14 == puVar19) {
            local_278 = *puVar19;
            uStack_270 = puVar14[3];
            local_288 = &local_278;
          }
          else {
            local_278 = *puVar19;
            local_288 = (ulong *)*puVar14;
          }
          local_280 = puVar14[1];
          *puVar14 = puVar19;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,*(char **)pSVar22,(allocator<char> *)&local_100);
          uVar21 = 0xf;
          if (local_288 != &local_278) {
            uVar21 = local_278;
          }
          if (uVar21 < (ulong)(local_180 + local_280)) {
            uVar21 = 0xf;
            if (local_188 != &local_178) {
              uVar21 = local_178;
            }
            if (uVar21 < (ulong)(local_180 + local_280)) goto LAB_0015a759;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,(ulong)local_288);
          }
          else {
LAB_0015a759:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_188);
          }
          puVar19 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_2d0.field_2._M_allocated_capacity = *puVar19;
            local_2d0.field_2._8_8_ = puVar14[3];
            local_2d0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *puVar19;
            local_2d0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_2d0._M_string_length = puVar14[1];
          *puVar14 = puVar19;
          puVar14[1] = 0;
          *(undefined1 *)puVar19 = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          puVar19 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_2a8.field_2._M_allocated_capacity = *puVar19;
            local_2a8.field_2._8_8_ = plVar13[3];
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *puVar19;
            local_2a8._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_2a8._M_string_length = plVar13[1];
          *plVar13 = (long)puVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          if (local_228 != &local_218) {
            operator_delete(local_228,local_218 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          pcVar17 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_2b0 + (int)*(undefined8 *)(*(long *)local_2b0 + -0x18));
          }
          else {
            sVar15 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar17,sVar15);
          }
          uVar25 = uVar25 + 1;
          pSVar22 = (SourceLocation *)&pSVar22->parent_construct;
        } while (pSVar22 != local_108[1].super_SourceLocation.parent_construct);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    pOVar26 = local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
LAB_0015a9e5:
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
LAB_0015aa12:
  pvVar7 = pOVar26->clauses_in_original_order;
  ppOVar23 = (pvVar7->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((pvVar7->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppOVar23) {
    local_e0 = local_e0 + 1;
    uVar21 = 0;
    do {
      pOVar8 = *ppOVar23;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      (*pOVar8->_vptr_OpenMPClause[1])(pOVar8,local_2b0,(ulong)local_e0,uVar21,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      uVar21 = (ulong)((int)uVar21 + 1);
      ppOVar23 = ppOVar23 + 1;
    } while (ppOVar23 !=
             (pvVar7->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void OpenMPDirective::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node, std::string trait_score) {

    std::string directive_kind;
    OpenMPDirectiveKind kind = this->getKind();
    switch(kind) {
        case OMPD_cancellation_point :
            directive_kind = "cancellation_point";
            break;
        case OMPD_for_simd:
            directive_kind = "for_simd";
            break;
        case OMPD_distribute_simd:
            directive_kind = "distribute_simd";
            break;
        case OMPD_distribute_parallel_for:
            directive_kind = "distribute_parallel_for";
            break; 
       case OMPD_distribute_parallel_do:
            directive_kind = "distribute_parallel_do";
            break;
        case OMPD_distribute_parallel_for_simd:
            directive_kind = "distribute_parallel_for_simd";
            break;
        case OMPD_distribute_parallel_do_simd:
            directive_kind = "distribute_parallel_do_simd";
            break;
        case OMPD_declare_reduction:
            directive_kind = "declare_reduction";
            break;
        case OMPD_declare_mapper:
            directive_kind = "declare_mapper";
            break;
        case OMPD_taskloop_simd:
            directive_kind = "taskloop_simd";
            break;
        case OMPD_target_data:
            directive_kind = "target_data";
            break;
        case OMPD_target_enter_data:
            directive_kind = "target_enter_data";
            break;
        case OMPD_target_exit_data:
            directive_kind = "target_exit_data";
            break;
        case OMPD_target_update:
            directive_kind = "target_update";
            break;
        case OMPD_declare_target:
            directive_kind = "declare_target";
            break;
        case OMPD_end_declare_target:
            directive_kind = "end_declare_target";
            break;
        case OMPD_depobj:
            directive_kind = "depobj ";
            break;
        case OMPD_teams_distribute:
            directive_kind += "teams_distribute ";
            break;
        case OMPD_teams_distribute_simd:
            directive_kind += "teams_distribute_simd ";
            break;
        case OMPD_teams_distribute_parallel_for:
            directive_kind += "teams_distribute_parallel_for ";
            break;
        case OMPD_teams_distribute_parallel_for_simd:
            directive_kind += "teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_loop:
            directive_kind += "teams_loop ";
            break;
        case OMPD_target_parallel:
            directive_kind += "target_parallel ";
            break;
        case OMPD_target_parallel_for:
            directive_kind += "target_parallel_for ";
            break;
        case OMPD_target_parallel_for_simd:
            directive_kind += "target_parallel_for_simd ";
            break;
        case OMPD_target_parallel_loop:
            directive_kind += "target_parallel_loop ";
            break;
        case OMPD_target_simd:
            directive_kind += "target_simd ";
            break;
        case OMPD_target_teams:
            directive_kind += "target_teams ";
            break;
        case OMPD_target_teams_distribute:
            directive_kind += "target_teams_distribute ";
            break;
        case OMPD_target_teams_distribute_simd:
            directive_kind += "target_teams_distribute_simd ";
            break;
        case OMPD_target_teams_loop:
            directive_kind += "target_teams_loop ";
            break;
        case OMPD_target_teams_distribute_parallel_for:
            directive_kind += "target_teams_distribute_parallel_for ";
            break;
        case OMPD_target_teams_distribute_parallel_for_simd:
            directive_kind += "target_teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_distribute_parallel_do:
            directive_kind += "teams distribute parallel do ";
            break;
        case OMPD_teams_distribute_parallel_do_simd:
            directive_kind += "teams distribute parallel do simd ";
            break;
        case OMPD_target_parallel_do:
            directive_kind += "target parallel do ";
            break;
        case OMPD_target_parallel_do_simd:
            directive_kind += "target parallel do simd ";
            break;
        case OMPD_target_teams_distribute_parallel_do:
            directive_kind += "target teams distribute parallel do ";
            break;
        case OMPD_target_teams_distribute_parallel_do_simd:
            directive_kind += "target teams distribute parallel do simd ";
            break;
        default:
            directive_kind = this->toString().substr(0, this->toString().size()-1);
    }
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string directive_id = parent_node + "_" + directive_kind + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + directive_id + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    dot_file << indent << directive_id.c_str() << " [label = \"" + directive_kind + "\"]\n";

    // output score
    if (trait_score != "") {
        current_line = indent + directive_id + " -- " + directive_id + "_score" + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + directive_id + "_score" + " [label = \"score\\n " + trait_score + "\"]\n";
        dot_file << current_line.c_str();
    }; 

    switch (kind) {
        case OMPD_allocate: {
            std::vector<const char *> *list = ((OpenMPAllocateDirective *) this)->getAllocateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "allocate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_threadprivate: {
            std::vector<const char *> *list = ((OpenMPThreadprivateDirective*)this)->getThreadprivateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "threadprivate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_declare_reduction: {
            std::vector<const char*>* list = ((OpenMPDeclareReductionDirective*)this)->getTypenameList();
            std::vector<const char*>::iterator list_item;
            std::string id = ((OpenMPDeclareReductionDirective*)this)->getIdentifier();
            std::string combiner = ((OpenMPDeclareReductionDirective*)this)->getCombiner();
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "declare_reduction";
            std::string node_id = tkind + "_reduction_identifier";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + id + "\"]\n";
            dot_file << current_line.c_str();
            list_name = tkind + "_typename_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            node_id = tkind + "_combiner";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + combiner + "\"]\n";
            dot_file << current_line.c_str();
            break;
        }
        default: {
            ;
        }
    };

    std::vector<OpenMPClause*>* clauses = this->getClausesInOriginalOrder();
    if (clauses->size() != 0) {
        std::vector<OpenMPClause*>::iterator iter;
        int clause_index = 0;
        for (iter = clauses->begin(); iter != clauses->end(); iter++) {
            (*iter)->generateDOT(dot_file, depth+1, clause_index, directive_id);
            clause_index += 1;
        };
    };

}